

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O3

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  int iVar2;
  int _h;
  int *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  short sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  char cVar11;
  void *pvVar12;
  uint uVar13;
  ushort uVar14;
  void *pvVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  ulong uVar19;
  uint uVar20;
  
  iVar10 = this->type_to;
  if (this->type_from == iVar10) {
    iVar10 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->packing = bottom_blob->packing;
      top_blob->allocator = bottom_blob->allocator;
      iVar9 = bottom_blob->w;
      iVar1 = bottom_blob->h;
      iVar2 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar9;
      top_blob->h = iVar1;
      top_blob->c = iVar2;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    _c = bottom_blob->c;
    iVar9 = bottom_blob->dims;
    iVar1 = bottom_blob->packing;
    sVar18 = (size_t)iVar1;
    if (iVar10 != 3) {
      if (iVar10 == 2) {
        sVar18 = (size_t)(iVar1 * 2);
      }
      else if (iVar10 == 1) {
        sVar18 = sVar18 * 4;
      }
      else {
        sVar18 = bottom_blob->elemsize;
      }
    }
    iVar2 = bottom_blob->w;
    _h = bottom_blob->h;
    if (iVar9 == 3) {
      Mat::create(top_blob,iVar2,_h,_c,sVar18,iVar1,opt->blob_allocator);
    }
    else if (iVar9 == 2) {
      Mat::create(top_blob,iVar2,_h,sVar18,iVar1,opt->blob_allocator);
    }
    else if (iVar9 == 1) {
      Mat::create(top_blob,iVar2,sVar18,iVar1,opt->blob_allocator);
    }
    pvVar12 = top_blob->data;
    iVar10 = -100;
    if ((pvVar12 != (void *)0x0) && (sVar18 = top_blob->cstep, (long)top_blob->c * sVar18 != 0)) {
      uVar13 = _h * iVar2 * iVar1;
      iVar10 = this->type_from;
      iVar9 = this->type_to;
      if (0 < (int)_c && (iVar9 == 2 && iVar10 == 1)) {
        pvVar15 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        sVar5 = top_blob->elemsize;
        sVar6 = bottom_blob->elemsize;
        uVar16 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar19 = 0;
            do {
              uVar17 = *(uint *)((long)pvVar15 + uVar19 * 4);
              uVar8 = uVar17 & 0x7fffff;
              cVar11 = (char)(uVar17 >> 0x17);
              uVar14 = (ushort)(uVar17 >> 0x10);
              sVar7 = (short)uVar14 >> 0xf;
              if (cVar11 == -1) {
                uVar14 = sVar7 * -0x8000 + (ushort)(uVar8 != 0) * 0x200 + 0x7c00;
              }
              else {
                uVar17 = uVar17 >> 0x17 & 0xff;
                if (uVar17 == 0) {
LAB_00153099:
                  uVar14 = sVar7 * -0x8000;
                }
                else if (uVar17 < 0x8f) {
                  if (uVar17 < 0x71) {
                    if (uVar17 < 0x66) goto LAB_00153099;
                    uVar14 = sVar7 * -0x8000 |
                             (ushort)((uVar8 | 0x800000) >> (0x7eU - cVar11 & 0x1f));
                  }
                  else {
                    uVar14 = (ushort)(uVar8 >> 0xd) | sVar7 * -0x8000 |
                             (uVar14 >> 7) * 0x400 + 0x4000;
                  }
                }
                else {
                  uVar14 = sVar7 * -0x8000 | 0x7c00;
                }
              }
              *(ushort *)((long)pvVar12 + uVar19 * 2) = uVar14;
              uVar19 = uVar19 + 1;
            } while (uVar13 != uVar19);
          }
          uVar16 = uVar16 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar5 * sVar18);
          pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar6);
        } while (uVar16 != _c);
        iVar9 = this->type_to;
      }
      if ((iVar9 == 1 && iVar10 == 2) && 0 < (int)_c) {
        pvVar12 = bottom_blob->data;
        sVar4 = bottom_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar15 = top_blob->data;
        sVar6 = top_blob->elemsize;
        uVar16 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar19 = 0;
            do {
              uVar14 = *(ushort *)((long)pvVar12 + uVar19 * 2 + sVar4 * sVar5 * uVar16);
              uVar17 = (uint)(uVar14 >> 0xf);
              uVar8 = uVar14 >> 10 & 0x1f;
              if (uVar8 == 0x1f) {
                uVar17 = (uint)uVar14 << 0xd | uVar17 << 0x1f | 0x7f800000;
              }
              else {
                uVar20 = uVar14 & 0x3ff;
                if ((uVar14 >> 10 & 0x1f) == 0) {
                  if ((short)uVar20 == 0) {
                    uVar17 = uVar17 << 0x1f;
                  }
                  else {
                    uVar8 = 0x38000000;
                    if ((uVar14 >> 9 & 1) == 0) {
                      iVar10 = 0;
                      do {
                        iVar10 = iVar10 + 1;
                        uVar8 = uVar20 >> 8;
                        uVar20 = uVar20 * 2;
                      } while ((uVar8 & 1) == 0);
                      uVar8 = iVar10 * -0x800000 + 0x38000000;
                    }
                    uVar17 = (uVar20 * 2 & 0x3fe) * 0x2000 + (uVar17 << 0x1f | uVar8);
                  }
                }
                else {
                  uVar17 = uVar20 * 0x2000 + (uVar8 << 0x17 | uVar17 << 0x1f) + 0x38000000;
                }
              }
              *(uint *)((long)pvVar15 + uVar19 * 4 + sVar18 * sVar6 * uVar16) = uVar17;
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar13);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != _c);
      }
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int packing = bottom_blob.packing;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * packing;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * packing;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = packing;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, packing, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, packing, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, packing, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * packing;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}